

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cc
# Opt level: O0

t_object * xemmai::t_type_of<t_pair>::f_define(t_container *a_library)

{
  t_type *this;
  t_object *ptVar1;
  t_fields local_48;
  t_container *local_10;
  t_container *a_library_local;
  
  local_10 = a_library;
  this = t_container::f_type<xemmai::t_object>(a_library);
  ptVar1 = t_object::f_of(local_10);
  local_48.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<xemmai::t_root,_std::allocator<xemmai::t_root>_>::vector(&local_48.v_instance);
  local_48.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::vector(&local_48.v_class);
  ptVar1 = t_type_of<xemmai::t_object>::f_derive<xemmai::t_type_of<t_pair>>(this,ptVar1,&local_48);
  t_fields::~t_fields(&local_48);
  return ptVar1;
}

Assistant:

t_object* t_type_of<t_pair>::f_define(t_container* a_library)
{
	return a_library->f_type<t_object>()->f_derive<t_type_of>(t_object::f_of(a_library), {});
}